

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  uint uVar1;
  sqlite3_index_constraint *psVar2;
  sqlite3_index_constraint_usage *psVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  char cVar9;
  int iVar10;
  long lVar11;
  char zIdxStr [41];
  
  zIdxStr[0x20] = '\0';
  zIdxStr[0x21] = '\0';
  zIdxStr[0x22] = '\0';
  zIdxStr[0x23] = '\0';
  zIdxStr[0x24] = '\0';
  zIdxStr[0x25] = '\0';
  zIdxStr[0x26] = '\0';
  zIdxStr[0x27] = '\0';
  zIdxStr[0x28] = '\0';
  zIdxStr[0x10] = '\0';
  zIdxStr[0x11] = '\0';
  zIdxStr[0x12] = '\0';
  zIdxStr[0x13] = '\0';
  zIdxStr[0x14] = '\0';
  zIdxStr[0x15] = '\0';
  zIdxStr[0x16] = '\0';
  zIdxStr[0x17] = '\0';
  zIdxStr[0x18] = '\0';
  zIdxStr[0x19] = '\0';
  zIdxStr[0x1a] = '\0';
  zIdxStr[0x1b] = '\0';
  zIdxStr[0x1c] = '\0';
  zIdxStr[0x1d] = '\0';
  zIdxStr[0x1e] = '\0';
  zIdxStr[0x1f] = '\0';
  zIdxStr[0] = '\0';
  zIdxStr[1] = '\0';
  zIdxStr[2] = '\0';
  zIdxStr[3] = '\0';
  zIdxStr[4] = '\0';
  zIdxStr[5] = '\0';
  zIdxStr[6] = '\0';
  zIdxStr[7] = '\0';
  zIdxStr[8] = '\0';
  zIdxStr[9] = '\0';
  zIdxStr[10] = '\0';
  zIdxStr[0xb] = '\0';
  zIdxStr[0xc] = '\0';
  zIdxStr[0xd] = '\0';
  zIdxStr[0xe] = '\0';
  zIdxStr[0xf] = '\0';
  uVar1 = pIdxInfo->nConstraint;
  lVar6 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  bVar4 = false;
  for (; uVar8 * 0xc - lVar6 != 0; lVar6 = lVar6 + 0xc) {
    if ((&pIdxInfo->aConstraint->op)[lVar6] == '@') {
      bVar4 = true;
    }
  }
  lVar11 = 0;
  lVar6 = 5;
  iVar10 = 0;
  do {
    if (((int)uVar1 <= lVar11) || (0x27 < iVar10)) {
      pIdxInfo->idxNum = 2;
      pIdxInfo->needToFreeIdxStr = 1;
      if (0 < iVar10) {
        pcVar7 = sqlite3_mprintf("%s",zIdxStr);
        pIdxInfo->idxStr = pcVar7;
        if (pcVar7 == (char *)0x0) {
          return 7;
        }
      }
      lVar6 = (long)tab[3].pModule >> ((byte)(iVar10 / 2) & 0x3f);
      pIdxInfo->estimatedCost = (double)lVar6 * 6.0;
      pIdxInfo->estimatedRows = lVar6;
      return 0;
    }
    psVar2 = pIdxInfo->aConstraint;
    cVar9 = *(char *)((long)&psVar2->iColumn + lVar6);
    if (bVar4) {
      if (cVar9 != '\0') {
LAB_001afd37:
        uVar5 = *(uint *)((long)psVar2 + lVar6 + -5);
LAB_001afd4b:
        if (((int)uVar5 < 1) || ((byte)tab[1].field_0xd < uVar5)) {
          if (*(char *)((long)psVar2 + lVar6 + -1) != '@') goto LAB_001afd86;
LAB_001afd61:
          cVar9 = 'F';
        }
        else {
          cVar9 = *(char *)((long)psVar2 + lVar6 + -1);
          if (cVar9 == '\x02') {
            cVar9 = 'A';
          }
          else {
            if (cVar9 == '@') goto LAB_001afd61;
            if (cVar9 == '\b') {
              cVar9 = 'B';
            }
            else if (cVar9 == '\x10') {
              cVar9 = 'C';
            }
            else if (cVar9 == ' ') {
              cVar9 = 'D';
            }
            else {
              if (cVar9 != '\x04') goto LAB_001afd86;
              cVar9 = 'E';
            }
          }
        }
        zIdxStr[iVar10] = cVar9;
        zIdxStr[(long)iVar10 + 1] = (char)uVar5 + '/';
        psVar3 = pIdxInfo->aConstraintUsage;
        psVar3[lVar11].argvIndex = (iVar10 + 2) / 2;
        psVar3[lVar11].omit = '\x01';
        iVar10 = iVar10 + 2;
      }
    }
    else if (cVar9 != '\0') {
      uVar5 = *(uint *)((long)psVar2 + lVar6 + -5);
      if (uVar5 == 0) {
        if (*(char *)((long)psVar2 + lVar6 + -1) == '\x02') {
          for (lVar6 = 0; lVar11 != lVar6; lVar6 = lVar6 + 1) {
            psVar3 = pIdxInfo->aConstraintUsage;
            psVar3[lVar6].argvIndex = 0;
            psVar3[lVar6].omit = '\0';
          }
          pIdxInfo->idxNum = 1;
          psVar3 = pIdxInfo->aConstraintUsage;
          psVar3[lVar11].argvIndex = 1;
          psVar3[lVar11].omit = '\x01';
          pIdxInfo->estimatedCost = 30.0;
          pIdxInfo->estimatedRows = 1;
          pIdxInfo->idxFlags = 1;
          return 0;
        }
        goto LAB_001afd37;
      }
      goto LAB_001afd4b;
    }
LAB_001afd86:
    lVar11 = lVar11 + 1;
    lVar6 = lVar6 + 0xc;
  } while( true );
}

Assistant:

static int rtreeBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  Rtree *pRtree = (Rtree*)tab;
  int rc = SQLITE_OK;
  int ii;
  int bMatch = 0;                 /* True if there exists a MATCH constraint */
  i64 nRow;                       /* Estimated rows returned by this scan */

  int iIdx = 0;
  char zIdxStr[RTREE_MAX_DIMENSIONS*8+1];
  memset(zIdxStr, 0, sizeof(zIdxStr));

  /* Check if there exists a MATCH constraint - even an unusable one. If there
  ** is, do not consider the lookup-by-rowid plan as using such a plan would
  ** require the VDBE to evaluate the MATCH constraint, which is not currently
  ** possible. */
  for(ii=0; ii<pIdxInfo->nConstraint; ii++){
    if( pIdxInfo->aConstraint[ii].op==SQLITE_INDEX_CONSTRAINT_MATCH ){
      bMatch = 1;
    }
  }

  assert( pIdxInfo->idxStr==0 );
  for(ii=0; ii<pIdxInfo->nConstraint && iIdx<(int)(sizeof(zIdxStr)-1); ii++){
    struct sqlite3_index_constraint *p = &pIdxInfo->aConstraint[ii];

    if( bMatch==0 && p->usable 
     && p->iColumn==0 && p->op==SQLITE_INDEX_CONSTRAINT_EQ 
    ){
      /* We have an equality constraint on the rowid. Use strategy 1. */
      int jj;
      for(jj=0; jj<ii; jj++){
        pIdxInfo->aConstraintUsage[jj].argvIndex = 0;
        pIdxInfo->aConstraintUsage[jj].omit = 0;
      }
      pIdxInfo->idxNum = 1;
      pIdxInfo->aConstraintUsage[ii].argvIndex = 1;
      pIdxInfo->aConstraintUsage[jj].omit = 1;

      /* This strategy involves a two rowid lookups on an B-Tree structures
      ** and then a linear search of an R-Tree node. This should be 
      ** considered almost as quick as a direct rowid lookup (for which 
      ** sqlite uses an internal cost of 0.0). It is expected to return
      ** a single row.
      */ 
      pIdxInfo->estimatedCost = 30.0;
      pIdxInfo->estimatedRows = 1;
      pIdxInfo->idxFlags = SQLITE_INDEX_SCAN_UNIQUE;
      return SQLITE_OK;
    }

    if( p->usable
    && ((p->iColumn>0 && p->iColumn<=pRtree->nDim2)
        || p->op==SQLITE_INDEX_CONSTRAINT_MATCH)
    ){
      u8 op;
      switch( p->op ){
        case SQLITE_INDEX_CONSTRAINT_EQ:    op = RTREE_EQ;    break;
        case SQLITE_INDEX_CONSTRAINT_GT:    op = RTREE_GT;    break;
        case SQLITE_INDEX_CONSTRAINT_LE:    op = RTREE_LE;    break;
        case SQLITE_INDEX_CONSTRAINT_LT:    op = RTREE_LT;    break;
        case SQLITE_INDEX_CONSTRAINT_GE:    op = RTREE_GE;    break;
        case SQLITE_INDEX_CONSTRAINT_MATCH: op = RTREE_MATCH; break;
        default:                            op = 0;           break;
      }
      if( op ){
        zIdxStr[iIdx++] = op;
        zIdxStr[iIdx++] = (char)(p->iColumn - 1 + '0');
        pIdxInfo->aConstraintUsage[ii].argvIndex = (iIdx/2);
        pIdxInfo->aConstraintUsage[ii].omit = 1;
      }
    }
  }

  pIdxInfo->idxNum = 2;
  pIdxInfo->needToFreeIdxStr = 1;
  if( iIdx>0 && 0==(pIdxInfo->idxStr = sqlite3_mprintf("%s", zIdxStr)) ){
    return SQLITE_NOMEM;
  }

  nRow = pRtree->nRowEst >> (iIdx/2);
  pIdxInfo->estimatedCost = (double)6.0 * (double)nRow;
  pIdxInfo->estimatedRows = nRow;

  return rc;
}